

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueDescriptor::GetLocationPath
          (EnumValueDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int *piVar1;
  iterator iVar2;
  int local_14;
  
  EnumDescriptor::GetLocationPath(*(EnumDescriptor **)(this + 0x18),output);
  iVar2._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar2._M_current == piVar1) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)output,iVar2,
               &EnumDescriptorProto::kValueFieldNumber);
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar2._M_current = 2;
    iVar2._M_current = iVar2._M_current + 1;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,&local_14);
  }
  else {
    *iVar2._M_current =
         (int)((ulong)((long)this - *(long *)(*(long *)(this + 0x18) + 0x30)) >> 3) * -0x33333333;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void EnumValueDescriptor::GetLocationPath(std::vector<int>* output) const {
  type()->GetLocationPath(output);
  output->push_back(EnumDescriptorProto::kValueFieldNumber);
  output->push_back(index());
}